

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_nullddi.cpp
# Opt level: O0

ze_result_t driver::zesFanSetDefaultMode(zes_fan_handle_t hFan)

{
  zes_pfnFanSetDefaultMode_t pfnSetDefaultMode;
  ze_result_t result;
  zes_fan_handle_t hFan_local;
  
  pfnSetDefaultMode._4_4_ = ZE_RESULT_SUCCESS;
  if (DAT_0011cd90 != (code *)0x0) {
    pfnSetDefaultMode._4_4_ = (*DAT_0011cd90)(hFan);
  }
  return pfnSetDefaultMode._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zesFanSetDefaultMode(
        zes_fan_handle_t hFan                           ///< [in] Handle for the component.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnSetDefaultMode = context.zesDdiTable.Fan.pfnSetDefaultMode;
        if( nullptr != pfnSetDefaultMode )
        {
            result = pfnSetDefaultMode( hFan );
        }
        else
        {
            // generic implementation
        }

        return result;
    }